

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmtime_s.c
# Opt level: O0

int main(void)

{
  tm *ptVar1;
  undefined1 local_3c [8];
  tm time;
  time_t t;
  
  time.tm_yday = -0x80000000;
  time.tm_isdst = -1;
  ptVar1 = gmtime_s((time_t *)&time.tm_yday,(tm *)local_3c);
  if (ptVar1 == (tm *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x2b,"gmtime_s( &t, &time ) != NULL");
  }
  if (local_3c._0_4_ != 0x34) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x2c,"time.tm_sec == 52");
  }
  if (local_3c._4_4_ != 0x2d) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x2d,"time.tm_min == 45");
  }
  if (time.tm_sec != 0x14) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x2e,"time.tm_hour == 20");
  }
  if (time.tm_min != 0xd) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x2f,"time.tm_mday == 13");
  }
  if (time.tm_hour != 0xb) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x30,"time.tm_mon == 11");
  }
  if (time.tm_mday != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x31,"time.tm_year == 1");
  }
  if (time.tm_mon != 5) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x32,"time.tm_wday == 5");
  }
  if (time.tm_year != 0x15a) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x33,"time.tm_yday == 346");
  }
  time.tm_yday = 0x7fffffff;
  time.tm_isdst = 0;
  ptVar1 = gmtime_s((time_t *)&time.tm_yday,(tm *)local_3c);
  if (ptVar1 == (tm *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x36,"gmtime_s( &t, &time ) != NULL");
  }
  if (local_3c._0_4_ != 7) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x37,"time.tm_sec == 7");
  }
  if (local_3c._4_4_ != 0xe) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x38,"time.tm_min == 14");
  }
  if (time.tm_sec != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x39,"time.tm_hour == 3");
  }
  if (time.tm_min != 0x13) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x3a,"time.tm_mday == 19");
  }
  if (time.tm_hour != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x3b,"time.tm_mon == 0");
  }
  if (time.tm_mday != 0x8a) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x3c,"time.tm_year == 138");
  }
  if (time.tm_mon != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x3d,"time.tm_wday == 2");
  }
  if (time.tm_year != 0x12) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x3e,"time.tm_yday == 18");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    time_t t;
    struct tm time;

    /* TODO: Constraint handling */

    t = -2147483648l;
    TESTCASE( gmtime_s( &t, &time ) != NULL );
    TESTCASE( time.tm_sec == 52 );
    TESTCASE( time.tm_min == 45 );
    TESTCASE( time.tm_hour == 20 );
    TESTCASE( time.tm_mday == 13 );
    TESTCASE( time.tm_mon == 11 );
    TESTCASE( time.tm_year == 1 );
    TESTCASE( time.tm_wday == 5 );
    TESTCASE( time.tm_yday == 346 );

    t = 2147483647l;
    TESTCASE( gmtime_s( &t, &time ) != NULL );
    TESTCASE( time.tm_sec == 7 );
    TESTCASE( time.tm_min == 14 );
    TESTCASE( time.tm_hour == 3 );
    TESTCASE( time.tm_mday == 19 );
    TESTCASE( time.tm_mon == 0 );
    TESTCASE( time.tm_year == 138 );
    TESTCASE( time.tm_wday == 2 );
    TESTCASE( time.tm_yday == 18 );
#endif

    return TEST_RESULTS;
}